

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O0

stbi_uc * stbi__psd_load(stbi__context *s,int *x,int *y,int *comp,int req_comp)

{
  stbi_uc sVar1;
  byte bVar2;
  stbi__uint32 sVar3;
  int iVar4;
  stbi__uint32 x_00;
  int iVar5;
  int iVar6;
  stbi__uint32 sVar7;
  int iVar8;
  uint uVar9;
  byte *pbVar10;
  float fVar11;
  float fVar12;
  float inv_a;
  float ra;
  float a;
  uchar *pixel;
  stbi_uc *psStack_80;
  stbi_uc val_1;
  stbi_uc *p_1;
  stbi_uc *psStack_70;
  stbi_uc val;
  stbi_uc *p;
  stbi_uc *out;
  int h;
  int w;
  int bitdepth;
  int len;
  int count;
  int i;
  int channel;
  int compression;
  int channelCount;
  int pixelCount;
  int req_comp_local;
  int *comp_local;
  int *y_local;
  int *x_local;
  stbi__context *s_local;
  
  sVar3 = stbi__get32be(s);
  if (sVar3 == 0x38425053) {
    iVar4 = stbi__get16be(s);
    if (iVar4 == 1) {
      stbi__skip(s,6);
      iVar4 = stbi__get16be(s);
      if ((iVar4 < 0) || (0x10 < iVar4)) {
        stbi__err("wrong channel count");
        s_local = (stbi__context *)0x0;
      }
      else {
        sVar3 = stbi__get32be(s);
        x_00 = stbi__get32be(s);
        iVar5 = stbi__get16be(s);
        if ((iVar5 == 8) || (iVar5 == 0x10)) {
          iVar6 = stbi__get16be(s);
          if (iVar6 == 3) {
            sVar7 = stbi__get32be(s);
            stbi__skip(s,sVar7);
            sVar7 = stbi__get32be(s);
            stbi__skip(s,sVar7);
            sVar7 = stbi__get32be(s);
            stbi__skip(s,sVar7);
            iVar6 = stbi__get16be(s);
            if (iVar6 < 2) {
              p = (stbi_uc *)stbi__malloc((long)(int)(x_00 * 4 * sVar3));
              if (p == (uchar *)0x0) {
                stbi__err("outofmem");
                s_local = (stbi__context *)0x0;
              }
              else {
                iVar8 = x_00 * sVar3;
                if (iVar6 == 0) {
                  for (count = 0; count < 4; count = count + 1) {
                    psStack_80 = p + count;
                    if (count < iVar4) {
                      if (iVar5 == 0x10) {
                        for (len = 0; len < iVar8; len = len + 1) {
                          iVar6 = stbi__get16be(s);
                          *psStack_80 = (stbi_uc)((uint)iVar6 >> 8);
                          psStack_80 = psStack_80 + 4;
                        }
                      }
                      else {
                        for (len = 0; len < iVar8; len = len + 1) {
                          sVar1 = stbi__get8(s);
                          *psStack_80 = sVar1;
                          psStack_80 = psStack_80 + 4;
                        }
                      }
                    }
                    else {
                      sVar1 = '\0';
                      if (count == 3) {
                        sVar1 = 0xff;
                      }
                      for (len = 0; len < iVar8; len = len + 1) {
                        *psStack_80 = sVar1;
                        psStack_80 = psStack_80 + 4;
                      }
                    }
                  }
                }
                else {
                  stbi__skip(s,sVar3 * iVar4 * 2);
                  for (count = 0; count < 4; count = count + 1) {
                    psStack_70 = p + count;
                    if (count < iVar4) {
                      bitdepth = 0;
                      while (bitdepth < iVar8) {
                        bVar2 = stbi__get8(s);
                        uVar9 = (uint)bVar2;
                        if (uVar9 != 0x80) {
                          if (uVar9 < 0x80) {
                            w = uVar9 + 1;
                            bitdepth = w + bitdepth;
                            for (; w != 0; w = w + -1) {
                              sVar1 = stbi__get8(s);
                              *psStack_70 = sVar1;
                              psStack_70 = psStack_70 + 4;
                            }
                          }
                          else if (0x80 < uVar9) {
                            w = (uVar9 ^ 0xff) + 2;
                            sVar1 = stbi__get8(s);
                            bitdepth = w + bitdepth;
                            for (; w != 0; w = w + -1) {
                              *psStack_70 = sVar1;
                              psStack_70 = psStack_70 + 4;
                            }
                          }
                        }
                      }
                    }
                    else {
                      for (len = 0; len < iVar8; len = len + 1) {
                        sVar1 = '\0';
                        if (count == 3) {
                          sVar1 = 0xff;
                        }
                        *psStack_70 = sVar1;
                        psStack_70 = psStack_70 + 4;
                      }
                    }
                  }
                }
                if (3 < iVar4) {
                  for (len = 0; len < (int)(x_00 * sVar3); len = len + 1) {
                    pbVar10 = p + (len << 2);
                    if ((pbVar10[3] != 0) && (pbVar10[3] != 0xff)) {
                      fVar12 = 1.0 / ((float)pbVar10[3] / 255.0);
                      fVar11 = (1.0 - fVar12) * 255.0;
                      *pbVar10 = (byte)(int)((float)*pbVar10 * fVar12 + fVar11);
                      pbVar10[1] = (byte)(int)((float)pbVar10[1] * fVar12 + fVar11);
                      pbVar10[2] = (byte)(int)((float)pbVar10[2] * fVar12 + fVar11);
                    }
                  }
                }
                if (((req_comp == 0) || (req_comp == 4)) ||
                   (p = stbi__convert_format(p,4,req_comp,x_00,sVar3), s_local = (stbi__context *)p,
                   (stbi__context *)p != (stbi__context *)0x0)) {
                  if (comp != (int *)0x0) {
                    *comp = 4;
                  }
                  *y = sVar3;
                  *x = x_00;
                  s_local = (stbi__context *)p;
                }
              }
            }
            else {
              stbi__err("bad compression");
              s_local = (stbi__context *)0x0;
            }
          }
          else {
            stbi__err("wrong color format");
            s_local = (stbi__context *)0x0;
          }
        }
        else {
          stbi__err("unsupported bit depth");
          s_local = (stbi__context *)0x0;
        }
      }
    }
    else {
      stbi__err("wrong version");
      s_local = (stbi__context *)0x0;
    }
  }
  else {
    stbi__err("not PSD");
    s_local = (stbi__context *)0x0;
  }
  return (stbi_uc *)s_local;
}

Assistant:

static stbi_uc *stbi__psd_load(stbi__context *s, int *x, int *y, int *comp, int req_comp)
{
   int   pixelCount;
   int channelCount, compression;
   int channel, i, count, len;
   int bitdepth;
   int w,h;
   stbi_uc *out;

   // Check identifier
   if (stbi__get32be(s) != 0x38425053)   // "8BPS"
      return stbi__errpuc("not PSD", "Corrupt PSD image");

   // Check file type version.
   if (stbi__get16be(s) != 1)
      return stbi__errpuc("wrong version", "Unsupported version of PSD image");

   // Skip 6 reserved bytes.
   stbi__skip(s, 6 );

   // Read the number of channels (R, G, B, A, etc).
   channelCount = stbi__get16be(s);
   if (channelCount < 0 || channelCount > 16)
      return stbi__errpuc("wrong channel count", "Unsupported number of channels in PSD image");

   // Read the rows and columns of the image.
   h = stbi__get32be(s);
   w = stbi__get32be(s);

   // Make sure the depth is 8 bits.
   bitdepth = stbi__get16be(s);
   if (bitdepth != 8 && bitdepth != 16)
      return stbi__errpuc("unsupported bit depth", "PSD bit depth is not 8 or 16 bit");

   // Make sure the color mode is RGB.
   // Valid options are:
   //   0: Bitmap
   //   1: Grayscale
   //   2: Indexed color
   //   3: RGB color
   //   4: CMYK color
   //   7: Multichannel
   //   8: Duotone
   //   9: Lab color
   if (stbi__get16be(s) != 3)
      return stbi__errpuc("wrong color format", "PSD is not in RGB color format");

   // Skip the Mode Data.  (It's the palette for indexed color; other info for other modes.)
   stbi__skip(s,stbi__get32be(s) );

   // Skip the image resources.  (resolution, pen tool paths, etc)
   stbi__skip(s, stbi__get32be(s) );

   // Skip the reserved data.
   stbi__skip(s, stbi__get32be(s) );

   // Find out if the data is compressed.
   // Known values:
   //   0: no compression
   //   1: RLE compressed
   compression = stbi__get16be(s);
   if (compression > 1)
      return stbi__errpuc("bad compression", "PSD has an unknown compression format");

   // Create the destination image.
   out = (stbi_uc *) stbi__malloc(4 * w*h);
   if (!out) return stbi__errpuc("outofmem", "Out of memory");
   pixelCount = w*h;

   // Initialize the data to zero.
   //memset( out, 0, pixelCount * 4 );

   // Finally, the image data.
   if (compression) {
      // RLE as used by .PSD and .TIFF
      // Loop until you get the number of unpacked bytes you are expecting:
      //     Read the next source byte into n.
      //     If n is between 0 and 127 inclusive, copy the next n+1 bytes literally.
      //     Else if n is between -127 and -1 inclusive, copy the next byte -n+1 times.
      //     Else if n is 128, noop.
      // Endloop

      // The RLE-compressed data is preceeded by a 2-byte data count for each row in the data,
      // which we're going to just skip.
      stbi__skip(s, h * channelCount * 2 );

      // Read the RLE data by channel.
      for (channel = 0; channel < 4; channel++) {
         stbi_uc *p;

         p = out+channel;
         if (channel >= channelCount) {
            // Fill this channel with default data.
            for (i = 0; i < pixelCount; i++, p += 4)
               *p = (channel == 3 ? 255 : 0);
         } else {
            // Read the RLE data.
            count = 0;
            while (count < pixelCount) {
               len = stbi__get8(s);
               if (len == 128) {
                  // No-op.
               } else if (len < 128) {
                  // Copy next len+1 bytes literally.
                  len++;
                  count += len;
                  while (len) {
                     *p = stbi__get8(s);
                     p += 4;
                     len--;
                  }
               } else if (len > 128) {
                  stbi_uc   val;
                  // Next -len+1 bytes in the dest are replicated from next source byte.
                  // (Interpret len as a negative 8-bit int.)
                  len ^= 0x0FF;
                  len += 2;
                  val = stbi__get8(s);
                  count += len;
                  while (len) {
                     *p = val;
                     p += 4;
                     len--;
                  }
               }
            }
         }
      }

   } else {
      // We're at the raw image data.  It's each channel in order (Red, Green, Blue, Alpha, ...)
      // where each channel consists of an 8-bit value for each pixel in the image.

      // Read the data by channel.
      for (channel = 0; channel < 4; channel++) {
         stbi_uc *p;

         p = out + channel;
         if (channel >= channelCount) {
            // Fill this channel with default data.
            stbi_uc val = channel == 3 ? 255 : 0;
            for (i = 0; i < pixelCount; i++, p += 4)
               *p = val;
         } else {
            // Read the data.
            if (bitdepth == 16) {
               for (i = 0; i < pixelCount; i++, p += 4)
                  *p = (stbi_uc) (stbi__get16be(s) >> 8);
            } else {
               for (i = 0; i < pixelCount; i++, p += 4)
                  *p = stbi__get8(s);
            }
         }
      }
   }

   if (channelCount >= 4) {
      for (i=0; i < w*h; ++i) {
         unsigned char *pixel = out + 4*i;
         if (pixel[3] != 0 && pixel[3] != 255) {
            // remove weird white matte from PSD
            float a = pixel[3] / 255.0f;
            float ra = 1.0f / a;
            float inv_a = 255.0f * (1 - ra);
            pixel[0] = (unsigned char) (pixel[0]*ra + inv_a);
            pixel[1] = (unsigned char) (pixel[1]*ra + inv_a);
            pixel[2] = (unsigned char) (pixel[2]*ra + inv_a);
         }
      }
   }

   if (req_comp && req_comp != 4) {
      out = stbi__convert_format(out, 4, req_comp, w, h);
      if (out == NULL) return out; // stbi__convert_format frees input on failure
   }

   if (comp) *comp = 4;
   *y = h;
   *x = w;

   return out;
}